

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O0

void movingAtomListProcessing(atom *initAtomLst,void *userdata)

{
  int iVar1;
  int iVar2;
  undefined1 local_e8 [8];
  chainEndData_t endData;
  atom *nexta;
  atom *prevAtomLst;
  atom *a;
  undefined1 auStack_20 [2];
  char prevChain [5];
  char prevInsCode;
  int rescnt;
  int previd;
  void *userdata_local;
  atom *initAtomLst_local;
  
  stack0xffffffffffffffe4 = 0;
  _auStack_20 = 0;
  a._7_1_ = ' ';
  nexta = (atom *)0x0;
  endData.hisNHcount[3] = 0;
  endData._164_4_ = 0;
  initEndData((chainEndData_t *)local_e8);
  a._3_1_ = 0x3f;
  a._2_1_ = 0x3f;
  a._4_1_ = 0;
  prevAtomLst = initAtomLst;
  do {
    if (prevAtomLst == (atom *)0x0) {
      if (_auStack_20 != 0) {
        resCheck((chainEndData_t *)local_e8,nexta,_auStack_20);
      }
      CtermCheck((chainEndData_t *)local_e8,_auStack_20,1);
      return;
    }
    endData._160_8_ = prevAtomLst->next;
    prevAtomLst->next = nexta;
    nexta = prevAtomLst;
    if ((prevAtomLst->r->resid == stack0xffffffffffffffe4) &&
       (prevAtomLst->r->resInsCode == a._7_1_)) {
      iVar1 = strcmp(prevAtomLst->r->chain,(char *)((long)&a + 2));
      if (iVar1 != 0) goto LAB_001323e8;
    }
    else {
LAB_001323e8:
      if (_auStack_20 != 0) {
        resCheck((chainEndData_t *)local_e8,prevAtomLst,_auStack_20);
      }
      iVar1 = _auStack_20;
      iVar2 = strcmp(prevAtomLst->r->chain,(char *)((long)&a + 2));
      CtermCheck((chainEndData_t *)local_e8,iVar1,(uint)(iVar2 != 0));
      iVar1 = _auStack_20 + 1;
      _auStack_20 = iVar1;
      iVar2 = strcmp(prevAtomLst->r->chain,(char *)((long)&a + 2));
      NtermCheck((chainEndData_t *)local_e8,iVar1,(uint)(iVar2 != 0));
      unique0x00011f80 = prevAtomLst->r->resid;
      a._7_1_ = prevAtomLst->r->resInsCode;
      strcpy((char *)((long)&a + 2),prevAtomLst->r->chain);
    }
    prevAtomLst->r->rescnt = _auStack_20;
    ProcessResInfo((chainEndData_t *)local_e8,prevAtomLst);
    prevAtomLst = (atom *)endData._160_8_;
  } while( true );
}

Assistant:

void movingAtomListProcessing(atom *initAtomLst, void *userdata)
{
   int previd = 0, rescnt = 0;
   char prevInsCode = ' ';
   char prevChain[5];
   atom *a = NULL, *prevAtomLst = NULL, *nexta = NULL;
   chainEndData_t endData;

   initEndData(&endData);

   prevChain[0] = prevChain[1] = '?';
   prevChain[2] = '\0';

   for(a=initAtomLst; a; a = nexta) {
      nexta = a->next;

      a->next = prevAtomLst; /* remove a from initial atom list */
      prevAtomLst = a;       /* and build up a reversed list of */
                             /* only atoms previously seen      */

      if (a->r->resid != previd || a->r->resInsCode != prevInsCode
                             || strcmp(a->r->chain, prevChain) != 0) {

	 if (rescnt){
	    resCheck(&endData, prevAtomLst, rescnt);
	 }
	 CtermCheck(&endData, rescnt, (strcmp(a->r->chain, prevChain) != 0));

	 ++rescnt;

	 NtermCheck(&endData, rescnt, (strcmp(a->r->chain, prevChain) != 0));
	 previd = a->r->resid;
	 prevInsCode = a->r->resInsCode;
	 strcpy(prevChain, a->r->chain);
         //prevChain[2] = '\0';
      }
      a->r->rescnt = rescnt;

      ProcessResInfo(&endData, a);
   }

   if (rescnt) { resCheck(&endData, prevAtomLst, rescnt); }
   CtermCheck(&endData, rescnt, TRUE);
}